

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.h
# Opt level: O3

int ZXing::QRCode::TerminatorBitsLength(Version *version)

{
  if (version->_type == Micro) {
    return version->_versionNumber * 2 + 1;
  }
  return (version->_type != rMQR) + 3;
}

Assistant:

Type type() const { return _type; }